

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool line_directives;
  bool bVar1;
  bool report_exceptions;
  ostream *poVar2;
  size_t __n;
  string *os;
  string *this;
  int iVar3;
  string source_file_path;
  string output_file_path;
  vector<kiste::line_t,_std::allocator<kiste::line_t>_> lines;
  string local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string local_4d0;
  parse_context ctx;
  ifstream ifs;
  byte abStack_418 [488];
  ofstream ofs;
  byte abStack_210 [480];
  
  source_file_path._M_dataplus._M_p = (pointer)&source_file_path.field_2;
  source_file_path._M_string_length = 0;
  output_file_path._M_dataplus._M_p = (pointer)&output_file_path.field_2;
  output_file_path._M_string_length = 0;
  source_file_path.field_2._M_local_buf[0] = '\0';
  report_exceptions = false;
  output_file_path.field_2._M_local_buf[0] = '\0';
  line_directives = true;
  for (iVar3 = 1; iVar3 < argc; iVar3 = iVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ifs,argv[iVar3],(allocator<char> *)&ofs);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ifs,"--output");
    std::__cxx11::string::~string((string *)&ifs);
    if (bVar1) {
      iVar3 = iVar3 + 1;
      if ((argc <= iVar3) || (output_file_path._M_string_length != 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4d0,"No output file given, or given twice",
                   (allocator<char> *)&ifs);
        usage(&local_4d0);
        this = &local_4d0;
        goto LAB_0010692c;
      }
      std::__cxx11::string::assign((char *)&output_file_path);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,argv[iVar3],(allocator<char> *)&ofs);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ifs,"--report-exceptions");
      std::__cxx11::string::~string((string *)&ifs);
      if (bVar1) {
        report_exceptions = true;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ifs,argv[iVar3],(allocator<char> *)&ofs);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ifs,"--no-line-directives");
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar1) {
          line_directives = false;
        }
        else {
          if (source_file_path._M_string_length != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ifs,"Extra argument: ",(allocator<char> *)&ofs);
            std::operator+(&local_4f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs
                           ,argv[iVar3]);
            usage(&local_4f0);
            std::__cxx11::string::~string((string *)&local_4f0);
            this = (string *)&ifs;
            goto LAB_0010692c;
          }
          std::__cxx11::string::assign((char *)&source_file_path);
        }
      }
    }
  }
  if (source_file_path._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"No input file given",(allocator<char> *)&ifs);
    usage(&local_510);
    this = &local_510;
LAB_0010692c:
    std::__cxx11::string::~string((string *)this);
    iVar3 = 1;
    goto LAB_001069c8;
  }
  std::ifstream::ifstream(&ifs,(string *)&source_file_path,_S_in);
  if ((abStack_418[*(long *)(_ifs + -0x18)] & 5) == 0) {
    std::ofstream::ofstream(&ofs);
    if (output_file_path._M_string_length == 0) {
      os = (string *)&std::cout;
LAB_00106940:
      kiste::parse_context::parse_context
                (&ctx,(istream *)&ifs,(ostream *)os,&source_file_path,report_exceptions,
                 line_directives);
      kiste::parse(&lines,&ctx);
      kiste::write((int)&ctx,&lines,__n);
      std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::~vector(&lines);
      iVar3 = 0;
      kiste::parse_context::~parse_context(&ctx);
    }
    else {
      os = (string *)&ofs;
      std::ofstream::open(os,(_Ios_Openmode)&output_file_path);
      if ((abStack_210[*(long *)(_ofs + -0x18)] & 5) == 0) goto LAB_00106940;
      poVar2 = std::operator<<((ostream *)&std::cerr,"Could not open output file ");
      poVar2 = std::operator<<(poVar2,(string *)&output_file_path);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar3 = 1;
    }
    std::ofstream::~ofstream(&ofs);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Could not open ");
    poVar2 = std::operator<<(poVar2,(string *)&source_file_path);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 1;
  }
  std::ifstream::~ifstream(&ifs);
LAB_001069c8:
  std::__cxx11::string::~string((string *)&output_file_path);
  std::__cxx11::string::~string((string *)&source_file_path);
  return iVar3;
}

Assistant:

auto main(int argc, char** argv) -> int
{
  auto source_file_path = std::string{};
  auto output_file_path = std::string{};
  auto report_exceptions = false;
  auto line_directives = true;

  for (int i = 1; i < argc; ++i)
  {
    if (std::string{argv[i]} == "--output")
    {
      if (i + 1 < argc and output_file_path.empty())
      {
        output_file_path = argv[i + 1];
        ++i;
      }
      else
      {
        return usage("No output file given, or given twice");
      }
    }
    else if (std::string{argv[i]} == "--report-exceptions")
    {
      report_exceptions = true;
    }
    else if (std::string{argv[i]} == "--no-line-directives")
    {
      line_directives = false;
    }
    else if (source_file_path.empty())
    {
      source_file_path = argv[i];
    }
    else
    {
      return usage(std::string{"Extra argument: "} + argv[i]);
    }
  }

  if (source_file_path.empty())
    return usage("No input file given");

  std::ifstream ifs{source_file_path};
  if (not ifs)
  {
    std::cerr << "Could not open " << source_file_path << std::endl;
    return 1;
  }

  std::ostream* os = &std::cout;
  std::ofstream ofs;
  if (not output_file_path.empty())
  {
    ofs.open(output_file_path, std::ios::out);
    if (not ofs)
    {
      std::cerr << "Could not open output file " << output_file_path << std::endl;
      return 1;
    }

    os = &ofs;
  }

  auto ctx = kiste::parse_context{ifs, *os, source_file_path, report_exceptions, line_directives};

  try
  {
    const auto lines = kiste::parse(ctx);
    kiste::write(ctx, lines);
  }
  catch (const kiste::parse_error& e)
  {
    std::cerr << "Parse error in file: " << ctx._filename << std::endl;
    std::cerr << "Line number: " << ctx._line_no << std::endl;
    std::cerr << "Message: " << e.what() << std::endl;
    std::cerr << "Line: " << ctx._line << std::endl;
    return 1;
  }
}